

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int PaletteSortModifiedZeng
              (WebPPicture *pic,uint32_t *palette_in,uint32_t num_colors,uint32_t *palette)

{
  byte bVar1;
  int iVar2;
  uint32_t *cooccurrence_00;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  uint16_t l_j;
  int32_t n;
  int32_t delta;
  uint8_t best_index;
  Sum *best_sum;
  uint32_t num_sums;
  uint32_t last;
  uint32_t first;
  Sum sums [256];
  uint32_t *cooccurrence;
  uint8_t remapping [256];
  uint32_t ind;
  uint32_t j;
  uint32_t i;
  size_t in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  int local_968;
  byte *local_960;
  uint local_954;
  uint local_950;
  uint local_94c;
  byte local_948 [4];
  uint auStack_944 [513];
  byte local_138 [4];
  uint32_t in_stack_fffffffffffffecc;
  uint32_t *in_stack_fffffffffffffed0;
  WebPPicture *in_stack_fffffffffffffed8;
  uint local_30;
  uint local_2c;
  int local_4;
  
  if (in_EDX < 2) {
    local_4 = 1;
  }
  else {
    cooccurrence_00 =
         (uint32_t *)
         WebPSafeCalloc(CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        in_stack_fffffffffffff680);
    if (cooccurrence_00 == (uint32_t *)0x0) {
      local_4 = 0;
    }
    else {
      iVar2 = CoOccurrenceBuild(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                in_stack_fffffffffffffecc,cooccurrence_00);
      if (iVar2 == 0) {
        WebPSafeFree((void *)0x188b06);
        local_4 = 0;
      }
      else {
        CoOccurrenceFindMax(cooccurrence_00,in_EDX,local_138,local_138 + 1);
        local_94c = 0;
        local_950 = 1;
        local_954 = in_EDX - 2;
        if (local_954 != 0) {
          local_960 = local_948;
          local_948[0] = 0;
          auStack_944[0] = 0;
          local_30 = 0;
          for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
            if ((local_2c != local_138[0]) && (local_2c != local_138[1])) {
              local_948[(ulong)local_30 * 8] = (byte)local_2c;
              auStack_944[(ulong)local_30 * 2] =
                   cooccurrence_00[local_2c * in_EDX + (uint)local_138[0]] +
                   cooccurrence_00[local_2c * in_EDX + (uint)local_138[1]];
              if (*(uint *)(local_960 + 4) < auStack_944[(ulong)local_30 * 2]) {
                local_960 = local_948 + (ulong)local_30 * 8;
              }
              local_30 = local_30 + 1;
            }
          }
          while (local_954 != 0) {
            bVar1 = *local_960;
            local_968 = 0;
            for (local_30 = 0; (local_94c + local_30) % in_EDX != local_950 + 1;
                local_30 = local_30 + 1) {
              local_968 = ((in_EDX - local_954) + -1 + local_30 * -2) *
                          cooccurrence_00
                          [bVar1 * in_EDX +
                           (uint)local_138[(ulong)(local_94c + local_30) % (ulong)in_EDX]] +
                          local_968;
            }
            if (local_968 < 1) {
              local_950 = local_950 + 1;
              local_138[local_950] = bVar1;
            }
            else {
              if (local_94c == 0) {
                local_94c = in_EDX - 1;
              }
              else {
                local_94c = local_94c - 1;
              }
              local_138[local_94c] = bVar1;
            }
            *(undefined8 *)local_960 = *(undefined8 *)(local_948 + (ulong)(local_954 - 1) * 8);
            local_954 = local_954 - 1;
            local_960 = local_948;
            for (local_2c = 0; local_2c < local_954; local_2c = local_2c + 1) {
              auStack_944[(ulong)local_2c * 2] =
                   cooccurrence_00[bVar1 * in_EDX + (uint)local_948[(ulong)local_2c * 8]] +
                   auStack_944[(ulong)local_2c * 2];
              if (*(uint *)(local_960 + 4) < auStack_944[(ulong)local_2c * 2]) {
                local_960 = local_948 + (ulong)local_2c * 8;
              }
            }
          }
        }
        WebPSafeFree((void *)0x188eab);
        for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
          *(undefined4 *)(in_RCX + (ulong)local_2c * 4) =
               *(undefined4 *)
                (in_RSI + (ulong)local_138[(ulong)(local_94c + local_2c) % (ulong)in_EDX] * 4);
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int PaletteSortModifiedZeng(const WebPPicture* const pic,
                                   const uint32_t* const palette_in,
                                   uint32_t num_colors,
                                   uint32_t* const palette) {
  uint32_t i, j, ind;
  uint8_t remapping[MAX_PALETTE_SIZE];
  uint32_t* cooccurrence;
  struct Sum sums[MAX_PALETTE_SIZE];
  uint32_t first, last;
  uint32_t num_sums;
  // TODO(vrabaud) check whether one color images should use palette or not.
  if (num_colors <= 1) return 1;
  // Build the co-occurrence matrix.
  cooccurrence =
      (uint32_t*)WebPSafeCalloc(num_colors * num_colors, sizeof(*cooccurrence));
  if (cooccurrence == NULL) {
    return 0;
  }
  if (!CoOccurrenceBuild(pic, palette_in, num_colors, cooccurrence)) {
    WebPSafeFree(cooccurrence);
    return 0;
  }

  // Initialize the mapping list with the two best indices.
  CoOccurrenceFindMax(cooccurrence, num_colors, &remapping[0], &remapping[1]);

  // We need to append and prepend to the list of remapping. To this end, we
  // actually define the next start/end of the list as indices in a vector (with
  // a wrap around when the end is reached).
  first = 0;
  last = 1;
  num_sums = num_colors - 2;  // -2 because we know the first two values
  if (num_sums > 0) {
    // Initialize the sums with the first two remappings and find the best one
    struct Sum* best_sum = &sums[0];
    best_sum->index = 0u;
    best_sum->sum = 0u;
    for (i = 0, j = 0; i < num_colors; ++i) {
      if (i == remapping[0] || i == remapping[1]) continue;
      sums[j].index = i;
      sums[j].sum = cooccurrence[i * num_colors + remapping[0]] +
                    cooccurrence[i * num_colors + remapping[1]];
      if (sums[j].sum > best_sum->sum) best_sum = &sums[j];
      ++j;
    }

    while (num_sums > 0) {
      const uint8_t best_index = best_sum->index;
      // Compute delta to know if we need to prepend or append the best index.
      int32_t delta = 0;
      const int32_t n = num_colors - num_sums;
      for (ind = first, j = 0; (ind + j) % num_colors != last + 1; ++j) {
        const uint16_t l_j = remapping[(ind + j) % num_colors];
        delta += (n - 1 - 2 * (int32_t)j) *
                 (int32_t)cooccurrence[best_index * num_colors + l_j];
      }
      if (delta > 0) {
        first = (first == 0) ? num_colors - 1 : first - 1;
        remapping[first] = best_index;
      } else {
        ++last;
        remapping[last] = best_index;
      }
      // Remove best_sum from sums.
      *best_sum = sums[num_sums - 1];
      --num_sums;
      // Update all the sums and find the best one.
      best_sum = &sums[0];
      for (i = 0; i < num_sums; ++i) {
        sums[i].sum += cooccurrence[best_index * num_colors + sums[i].index];
        if (sums[i].sum > best_sum->sum) best_sum = &sums[i];
      }
    }
  }
  assert((last + 1) % num_colors == first);
  WebPSafeFree(cooccurrence);

  // Re-map the palette.
  for (i = 0; i < num_colors; ++i) {
    palette[i] = palette_in[remapping[(first + i) % num_colors]];
  }
  return 1;
}